

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
argstest::PositionalBase::Validate(PositionalBase *this,string *param_1,string *param_2)

{
  int iVar1;
  ostream *poVar2;
  ostringstream problem;
  string asStack_1a8 [32];
  ostringstream local_188 [376];
  
  if (((this->super_NamedBase).super_Base.options & Required) != None) {
    iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
    if ((char)iVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar2 = std::operator<<((ostream *)local_188,"Option \'");
      (*(this->super_NamedBase).super_Base._vptr_Base[0x14])(asStack_1a8,this);
      poVar2 = std::operator<<(poVar2,asStack_1a8);
      std::operator<<(poVar2,"\' is required");
      std::__cxx11::string::~string(asStack_1a8);
      (this->super_NamedBase).super_Base.error = Required;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_NamedBase).super_Base.errorMsg,asStack_1a8);
      std::__cxx11::string::~string(asStack_1a8);
      std::__cxx11::ostringstream::~ostringstream(local_188);
    }
  }
  return;
}

Assistant:

bool IsRequired() const noexcept
            {
                return (GetOptions() & Options::Required) != Options::None;
            }